

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddGeneratorTarget
          (cmLocalGenerator *this,
          unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt)

{
  string *__args;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *gt_ptr;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt_local;
  cmLocalGenerator *this_local;
  
  gt_ptr = (cmGeneratorTarget *)gt;
  gt_local = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)this;
  local_20 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get(gt);
  std::
  vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ::push_back(&this->GeneratorTargets,gt);
  __args = cmGeneratorTarget::GetName_abi_cxx11_(local_20);
  std::
  unordered_map<std::__cxx11::string,cmGeneratorTarget*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>>
  ::emplace<std::__cxx11::string_const&,cmGeneratorTarget*&>
            ((unordered_map<std::__cxx11::string,cmGeneratorTarget*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>>
              *)&this->GeneratorTargetSearchIndex,__args,&local_20);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_20);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(
  std::unique_ptr<cmGeneratorTarget> gt)
{
  cmGeneratorTarget* gt_ptr = gt.get();

  this->GeneratorTargets.push_back(std::move(gt));
  this->GeneratorTargetSearchIndex.emplace(gt_ptr->GetName(), gt_ptr);
  this->GlobalGenerator->IndexGeneratorTarget(gt_ptr);
}